

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_28bf56::PulseMainloop::waitForOperation
          (PulseMainloop *this,pa_operation *op,unique_lock<std::mutex> *plock)

{
  int iVar1;
  
  if (op != (pa_operation *)0x0) {
    iVar1 = (*(anonymous_namespace)::ppa_operation_get_state)(op);
    if (iVar1 == 0) {
      do {
        std::condition_variable::wait((unique_lock *)&this->mCondVar);
        iVar1 = (*(anonymous_namespace)::ppa_operation_get_state)(op);
      } while (iVar1 == 0);
    }
    (*(anonymous_namespace)::ppa_operation_unref)(op);
    return;
  }
  return;
}

Assistant:

void waitForOperation(pa_operation *op, std::unique_lock<std::mutex> &plock)
    {
        if(op)
        {
            mCondVar.wait(plock,
                [op]() -> bool { return pa_operation_get_state(op) != PA_OPERATION_RUNNING; });
            pa_operation_unref(op);
        }
    }